

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeKernelGetIndirectAccess
          (ze_kernel_handle_t hKernel,ze_kernel_indirect_access_flags_t *pFlags)

{
  ze_result_t zVar1;
  
  if (DAT_0010e668 != (code *)0x0) {
    zVar1 = (*DAT_0010e668)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeKernelGetIndirectAccess(
        ze_kernel_handle_t hKernel,                     ///< [in] handle of the kernel object
        ze_kernel_indirect_access_flags_t* pFlags       ///< [out] query result for kernel indirect access flags.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetIndirectAccess = context.zeDdiTable.Kernel.pfnGetIndirectAccess;
        if( nullptr != pfnGetIndirectAccess )
        {
            result = pfnGetIndirectAccess( hKernel, pFlags );
        }
        else
        {
            // generic implementation
        }

        return result;
    }